

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O2

RowGroupWriteData * __thiscall
duckdb::RowGroup::WriteToDisk
          (RowGroupWriteData *__return_storage_ptr__,RowGroup *this,RowGroupWriter *writer)

{
  PartialBlockManager *pPVar1;
  RowGroupWriteData *pRVar2;
  CompressionType CVar3;
  ColumnData *pCVar4;
  InternalException *this_00;
  ulong c;
  allocator local_71;
  RowGroupWriteData *local_70;
  RowGroupWriteInfo info;
  vector<duckdb::CompressionType,_true> compression_types;
  
  compression_types.super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
  super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  compression_types.super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
  super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  compression_types.super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>.
  super__Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_70 = __return_storage_ptr__;
  ::std::vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>::reserve
            (&compression_types.
              super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>,
             (long)(this->columns).
                   super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   .
                   super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->columns).
                   super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   .
                   super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  c = 0;
  while( true ) {
    if ((ulong)((long)(this->columns).
                      super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                      .
                      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->columns).
                      super_vector<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                      .
                      super__Vector_base<duckdb::shared_ptr<duckdb::ColumnData,_true>,_std::allocator<duckdb::shared_ptr<duckdb::ColumnData,_true>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 4) <= c) {
      pPVar1 = writer->partial_block_manager;
      info.checkpoint_type = (*writer->_vptr_RowGroupWriter[2])(writer);
      pRVar2 = local_70;
      info.manager = pPVar1;
      info.compression_types =
           (vector<duckdb::CompressionType,_true> *)
           &compression_types.
            super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>;
      WriteToDisk(local_70,this,&info);
      ::std::_Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>::
      ~_Vector_base((_Vector_base<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>
                     *)&compression_types);
      return pRVar2;
    }
    pCVar4 = GetColumn(this,c);
    if ((pCVar4->count).super___atomic_base<unsigned_long>._M_i !=
        (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>._M_i)
    break;
    CVar3 = RowGroupWriter::GetColumnCompressionType(writer,c);
    info.manager = (PartialBlockManager *)CONCAT71(info.manager._1_7_,CVar3);
    ::std::vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>::
    emplace_back<duckdb::CompressionType>
              (&compression_types.
                super_vector<duckdb::CompressionType,_std::allocator<duckdb::CompressionType>_>,
               (CompressionType *)&info);
    c = c + 1;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&info,
             "Corrupted in-memory column - column with index %llu has misaligned count (row group has %llu rows, column has %llu)"
             ,&local_71);
  InternalException::InternalException<unsigned_long,unsigned_long,unsigned_long>
            (this_00,(string *)&info,c,
             (this->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>.
             _M_i,(pCVar4->count).super___atomic_base<unsigned_long>._M_i);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

RowGroupWriteData RowGroup::WriteToDisk(RowGroupWriter &writer) {
	vector<CompressionType> compression_types;
	compression_types.reserve(columns.size());
	for (idx_t column_idx = 0; column_idx < GetColumnCount(); column_idx++) {
		auto &column = GetColumn(column_idx);
		if (column.count != this->count) {
			throw InternalException("Corrupted in-memory column - column with index %llu has misaligned count (row "
			                        "group has %llu rows, column has %llu)",
			                        column_idx, this->count.load(), column.count.load());
		}
		compression_types.push_back(writer.GetColumnCompressionType(column_idx));
	}

	RowGroupWriteInfo info(writer.GetPartialBlockManager(), compression_types, writer.GetCheckpointType());
	return WriteToDisk(info);
}